

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gem_GIF.cpp
# Opt level: O0

Am_Generic_Image * Am_GIF_Image::Create(char *filename)

{
  bool bVar1;
  uchar uVar2;
  byte bVar3;
  int iVar4;
  uint flags;
  uchar *puVar5;
  bool bVar6;
  int blksize;
  int c;
  int read_an_image;
  int byte;
  int flag;
  ifstream ifs;
  byte local_148 [3];
  byte local_145;
  ushort local_144;
  unsigned_short local_142;
  uchar buf [256];
  undefined1 local_3a [8];
  GIF_Load_Info gli;
  Am_GIF_Image *im;
  char *filename_local;
  
  filename_local = (char *)operator_new(0x20);
  Am_GIF_Image((Am_GIF_Image *)filename_local);
  if ((Am_GIF_Image *)filename_local == (Am_GIF_Image *)0x0) {
    filename_local = (char *)0x0;
  }
  else {
    std::ifstream::ifstream(&flag,filename,_S_in);
    bVar3 = std::ios::operator!((ios *)((long)&flag + *(long *)(_flag + -0x18)));
    if ((bVar3 & 1) == 0) {
      (((Am_GIF_Image *)filename_local)->super_Am_Generic_Image).iminfo.depth = 8;
      std::istream::read((char *)&flag,(long)local_3a);
      iVar4 = strncmp(local_3a,"GIF",3);
      if ((iVar4 == 0) || (local_3a[3] == '8')) {
        std::istream::read((char *)&flag,(long)local_148);
        if (((local_144 & 0x80) == 0) ||
           (iVar4 = load_gif_colormap((Am_GIF_Image *)filename_local,(ifstream *)&flag,
                                      (uint)(byte)local_144), iVar4 != 0)) {
          c = 0;
          bVar1 = false;
          while( true ) {
            while( true ) {
              bVar6 = false;
              if (!bVar1) {
                c = std::istream::get();
                bVar6 = c != 0x3b;
              }
              if (!bVar6) goto LAB_0020fd69;
              if (c != 0x21) break;
              iVar4 = std::istream::get();
              if (iVar4 != 0xfe) {
                if (iVar4 == 0xf9) {
                  std::istream::get();
                  std::istream::read((char *)&flag,(long)local_148);
                  if ((local_148[0] & 1) != 0) {
                    (((Am_GIF_Image *)filename_local)->super_Am_Generic_Image).iminfo.transparent =
                         true;
                    (((Am_GIF_Image *)filename_local)->super_Am_Generic_Image).iminfo.
                    raw_transparent_color_index = (ushort)local_145;
                  }
                }
                else {
                  std::istream::get();
                  std::istream::read((char *)&flag,(long)local_148);
                }
              }
              while (iVar4 = std::istream::get(), iVar4 != 0) {
                std::istream::read((char *)&flag,(long)local_148);
              }
            }
            if (c != 0x2c) {
              std::operator<<((ostream *)&std::cerr,"** error reading gif file.\n");
              if ((Am_GIF_Image *)filename_local != (Am_GIF_Image *)0x0) {
                ~Am_GIF_Image((Am_GIF_Image *)filename_local);
                operator_delete(filename_local);
              }
              filename_local = (char *)0x0;
              goto LAB_0020fd69;
            }
            std::istream::read((char *)&flag,(long)local_148);
            uVar2 = buf[0];
            (((Am_GIF_Image *)filename_local)->super_Am_Generic_Image).iminfo.width = local_144;
            (((Am_GIF_Image *)filename_local)->super_Am_Generic_Image).iminfo.height = local_142;
            flags = (uint)buf[0];
            local_3a._6_2_ = (undefined2)((flags & 0x40) >> 6);
            puVar5 = (uchar *)operator_new__((ulong)(((Am_GIF_Image *)filename_local)->
                                                    super_Am_Generic_Image).iminfo.width *
                                             (ulong)((((Am_GIF_Image *)filename_local)->
                                                     super_Am_Generic_Image).iminfo.height + 10));
            (((Am_GIF_Image *)filename_local)->super_Am_Generic_Image).imdata = puVar5;
            if ((((Am_GIF_Image *)filename_local)->super_Am_Generic_Image).imdata == (uchar *)0x0) {
              if ((Am_GIF_Image *)filename_local != (Am_GIF_Image *)0x0) {
                ~Am_GIF_Image((Am_GIF_Image *)filename_local);
                operator_delete(filename_local);
              }
              filename_local = (char *)0x0;
              goto LAB_0020fd69;
            }
            if (((uVar2 & 0x80) != 0) &&
               (iVar4 = load_gif_colormap((Am_GIF_Image *)filename_local,(ifstream *)&flag,flags),
               iVar4 == 0)) {
              if ((Am_GIF_Image *)filename_local != (Am_GIF_Image *)0x0) {
                ~Am_GIF_Image((Am_GIF_Image *)filename_local);
                operator_delete(filename_local);
              }
              filename_local = (char *)0x0;
              goto LAB_0020fd69;
            }
            if (((((Am_GIF_Image *)filename_local)->super_Am_Generic_Image).iminfo.transparent & 1U)
                != 0) {
              adjust_colormap((Am_GIF_Image *)filename_local);
            }
            iVar4 = process_gif((Am_GIF_Image *)filename_local,(ifstream *)&flag,
                                (GIF_Load_Info *)local_3a);
            if (iVar4 == 0) break;
            bVar1 = true;
          }
          std::operator<<((ostream *)&std::cerr,"** error reading gif file.\n");
          if ((Am_GIF_Image *)filename_local != (Am_GIF_Image *)0x0) {
            ~Am_GIF_Image((Am_GIF_Image *)filename_local);
            operator_delete(filename_local);
          }
          filename_local = (char *)0x0;
        }
        else {
          if ((Am_GIF_Image *)filename_local != (Am_GIF_Image *)0x0) {
            ~Am_GIF_Image((Am_GIF_Image *)filename_local);
            operator_delete(filename_local);
          }
          filename_local = (char *)0x0;
        }
      }
      else {
        if ((Am_GIF_Image *)filename_local != (Am_GIF_Image *)0x0) {
          ~Am_GIF_Image((Am_GIF_Image *)filename_local);
          operator_delete(filename_local);
        }
        filename_local = (char *)0x0;
      }
    }
    else {
      if ((Am_GIF_Image *)filename_local != (Am_GIF_Image *)0x0) {
        ~Am_GIF_Image((Am_GIF_Image *)filename_local);
        operator_delete(filename_local);
      }
      filename_local = (char *)0x0;
    }
LAB_0020fd69:
    std::ifstream::~ifstream(&flag);
  }
  return (Am_Generic_Image *)filename_local;
}

Assistant:

Am_Generic_Image *
Am_GIF_Image::Create(const char *filename)
{
  Am_GIF_Image *im = new Am_GIF_Image;
  if (im == nullptr)
    return nullptr; // couldn't allocate the temp_image.
  GIF_Load_Info gli;

  // Buffer to hold a block of image data from the GIF file.
  unsigned char buf[256];

  // Open file for reading
  std::ifstream ifs(filename, std::ios::in);

  if (!ifs) {
    delete im;
    return nullptr;
  }

  // all Am_GIF_Image images have depth 8
  im->iminfo.depth = 8;

  // Read GIF header
  // ifs.read((unsigned char*)&gli.hdr, GIF_SIG_LEN); MSL
  ifs.read((char *)&gli.hdr, GIF_SIG_LEN);

  // Check if image file format is acceptable
  if (strncmp(gli.hdr.signature, "GIF", 3) != 0 && gli.hdr.version[0] != '8') {
    delete im;
    return nullptr;
  }

  // Read the logical screen descriptor.  We only use the flags field.
  // ifs.read(buf, GIF_SD_SIZE); MSL
  ifs.read((char *)buf, GIF_SD_SIZE);
  int flag = buf[4];

  // If a global color table is present, read it.
  if (flag & HAS_CT) {
    if (!(im->load_gif_colormap(ifs, flag))) {
      delete im;
      return nullptr;
    }
  }

  // Next comes a series of graphics blocks or special-purpose
  // blocks
  int byte = 0, read_an_image = 0;
  while (!read_an_image && (byte = ifs.get()) != GIF_TRAILER) {
    // Locate an image descriptor and read the image data
    int c;
    switch (byte) {
    case GIF_EXTSTART: {
      c = ifs.get();
      if (c == GIF_COMMENT) {
      } else if (c == GIF_GCE) {
        c = ifs.get(); // BlockSize always 4
        // ifs.read(buf, GIF_GCE_SIZE); MSL
        ifs.read((char *)buf, GIF_GCE_SIZE);
        flag = buf[GIF_GCE_PACKED];
        if (flag & TRANSPARENT) {
          im->iminfo.transparent = true;
          im->iminfo.raw_transparent_color_index = buf[GIF_GCE_COLORINDEX];
        }
      } else {
        int blksize = ifs.get();
        // ifs.read(buf, blksize); MSL
        ifs.read((char *)buf, blksize);
      }
      while ((c = ifs.get()) != 0)
        //ifs.read(buf, c); MSL
        ifs.read((char *)buf, c);
      break;
    }
    case GIF_IMGSTART: {
      // Read GIF image information
      // ifs.read(buf, GIF_ID_SIZE); MSL
      ifs.read((char *)buf, GIF_ID_SIZE);
      im->iminfo.width = (buf[5] << 8) + buf[4];
      im->iminfo.height = (buf[7] << 8) + buf[6];
      flag = buf[8];

      gli.interlaced = (flag & INTERLACED) ? 1 : 0;

      // Allocate memory for the GIF image and read in GIF image
      // into this array
      im->imdata = new unsigned char[(long)(im->iminfo.width) *
                                     (long)(im->iminfo.height + 10)];
      if (im->imdata == nullptr) { // failed to allocate image data
        delete im;
        return nullptr;
      }

      // Read local color table, if any
      if (flag & HAS_CT) {
        if (!(im->load_gif_colormap(ifs, flag))) {
          delete im;
          return nullptr;
        }
      }

      // force index of transparent color to be 0
      // to support X stipple raster ops
      if (im->iminfo.transparent) {
        im->adjust_colormap();
      }

      // Process the encoded data stream from the file.
      if (!(im->process_gif(ifs, gli))) {
        std::cerr << "** error reading gif file.\n";
        delete im;
        return nullptr;
      };
      read_an_image = 1;
      break;
    }
    default: {
      std::cerr << "** error reading gif file.\n";
      delete im;
      return nullptr;
    }
    }
  }
  // Success!
  return im;
}